

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O1

bool __thiscall MipsParser::parseVfpuCondition(MipsParser *this,Parser *parser,int *result)

{
  void *__s1;
  size_t __n;
  char *__s;
  int iVar1;
  Token *pTVar2;
  size_t sVar3;
  char **ppcVar4;
  ulong uVar5;
  size_type __rlen;
  bool bVar6;
  
  pTVar2 = Tokenizer::nextToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
  if (pTVar2->type == Identifier) {
    if (*(__index_type *)
         ((long)&(pTVar2->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x04') {
      __assert_fail("std::holds_alternative<Identifier>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x4d,"const Identifier &Token::identifierValue() const");
    }
    __s1 = *(void **)&(pTVar2->value).
                      super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                      super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      ._M_u;
    __n = *(size_t *)
           ((long)&(pTVar2->value).
                   super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .
                   super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
           + 8);
    uVar5 = 0xffffffffffffffff;
    ppcVar4 = parseVfpuCondition::conditions;
    do {
      __s = *ppcVar4;
      sVar3 = strlen(__s);
      if ((__n == sVar3) && ((__n == 0 || (iVar1 = bcmp(__s1,__s,__n), iVar1 == 0)))) {
        *result = (int)uVar5 + 1;
        return true;
      }
      uVar5 = uVar5 + 1;
      ppcVar4 = ppcVar4 + 1;
      bVar6 = uVar5 < 0xf;
    } while (uVar5 != 0xf);
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool MipsParser::parseVfpuCondition(Parser& parser, int& result)
{
	static const char* conditions[] = {
		"fl", "eq", "lt", "le", "tr", "ne", "ge", "gt",
		"ez", "en", "ei", "es", "nz", "nn", "ni", "ns"
	};

	const Token& token = parser.nextToken();
	if (token.type != TokenType::Identifier)
		return false;

	const Identifier &stringValue = token.identifierValue();
	for (size_t i = 0; i <  std::size(conditions); i++)
	{
		if (stringValue == conditions[i])
		{
			result = (int)i;
			return true;
		}
	}

	return false;
}